

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_ReverseKnotVector(int order,int cv_count,double *knot)

{
  double dVar1;
  int local_38;
  int local_34;
  int j;
  int i;
  double t;
  int knot_count;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  if (((order < 2) || (cv_count < order)) || (knot == (double *)0x0)) {
    cv_count_local._3_1_ = false;
  }
  else {
    local_38 = order + cv_count + -3;
    for (local_34 = 0; local_34 <= local_38; local_34 = local_34 + 1) {
      dVar1 = knot[local_34];
      knot[local_34] = -knot[local_38];
      knot[local_38] = -dVar1;
      local_38 = local_38 + -1;
    }
    cv_count_local._3_1_ = true;
  }
  return cv_count_local._3_1_;
}

Assistant:

bool ON_ReverseKnotVector(
       int order,
       int cv_count,
       double* knot
       )
{
  if ( order < 2 || cv_count < order || knot == nullptr )
    return false;
  const int knot_count = (order+cv_count-2);
  double t;
  int i, j;
  for ( i = 0, j = knot_count-1; i <= j; i++, j-- ) {
    t = knot[i];
    knot[i] = -knot[j];
    knot[j] = -t;
  }
  return true;
}